

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool PerlinNoise<Blob<224>>
               (hashfunc<Blob<224>_> hash,int inputLen,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  bool result;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  bool in_stack_000000bb;
  bool in_stack_000000bc;
  bool in_stack_000000bd;
  bool in_stack_000000be;
  bool in_stack_000000bf;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_000000c0;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_000000e8;
  pfHash in_stack_000000f0;
  int in_stack_000000f8;
  int in_stack_000000fc;
  int in_stack_00000100;
  int in_stack_00000104;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffd0;
  hashfunc local_8 [8];
  
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x18b0b3);
  hashfunc::operator_cast_to_function_pointer(local_8);
  PerlinNoiseTest<Blob<224>>
            (in_stack_00000104,in_stack_00000100,in_stack_000000fc,in_stack_000000f8,
             in_stack_000000f0,in_stack_000000e8);
  bVar1 = TestHashList<Blob<224>>
                    (in_stack_000000c0,in_stack_000000bf,in_stack_000000be,in_stack_000000bd,
                     in_stack_000000bc,in_stack_000000bb);
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_ffffffffffffffd0);
  return bVar1;
}

Assistant:

bool PerlinNoise ( hashfunc<hashtype> hash, int inputLen,
                   bool testColl, bool testDist, bool drawDiagram )
{
  //----------

  std::vector<hashtype> hashes;

  PerlinNoiseTest(12, 12, inputLen, 1, hash,hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}